

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_merger.cpp
# Opt level: O3

void __thiscall duckdb::ARTMerger::MergePrefixes(ARTMerger *this,NodeEntry *entry)

{
  byte bVar1;
  byte pos;
  uint8_t byte;
  uint8_t byte_00;
  Node *pNVar2;
  data_ptr_t node;
  GateStatus GVar3;
  ulong uVar4;
  idx_t iVar5;
  Node l_child;
  Prefix l_prefix;
  Prefix r_prefix;
  reference<Node> ref;
  Node local_88;
  optional_idx local_80;
  Prefix local_78;
  Prefix local_60;
  Prefix local_48;
  
  Prefix::Prefix(&local_78,this->art,(Node)(entry->left->super_IndexPointer).data,true,false);
  Prefix::Prefix(&local_60,this->art,(Node)(entry->right->super_IndexPointer).data,true,false);
  bVar1 = this->art->prefix_count;
  pos = local_60.data[bVar1];
  if (local_78.data[bVar1] < local_60.data[bVar1]) {
    pos = local_78.data[bVar1];
  }
  if (pos != 0) {
    iVar5 = 0;
    do {
      if (local_78.data[iVar5] != local_60.data[iVar5]) {
        optional_idx::optional_idx((optional_idx *)&local_48,iVar5);
        local_80.index = (idx_t)local_48.data;
        if (local_48.data != (data_ptr_t)0xffffffffffffffff) {
          iVar5 = optional_idx::GetIndex(&local_80);
          Prefix::Prefix(&local_48,this->art,(Node)(entry->left->super_IndexPointer).data,false,
                         false);
          uVar4 = iVar5 & 0xff;
          byte = local_48.data[uVar4];
          Prefix::Prefix(&local_48,this->art,(Node)(entry->right->super_IndexPointer).data,false,
                         false);
          byte_00 = local_48.data[uVar4];
          local_48.data = (data_ptr_t)entry->left;
          local_88.super_IndexPointer.data = (IndexPointer)0;
          GVar3 = Prefix::Split(this->art,(reference<Node> *)&local_48,&local_88,(uint8_t)iVar5);
          Prefix::Reduce(this->art,entry->right,uVar4);
          node = local_48.data;
          BaseNode<(unsigned_char)'\x04',_(duckdb::NType)3>::New(this->art,(Node *)local_48.data);
          if (GVar3 == GATE_NOT_SET) {
            uVar4 = ((IndexPointer *)node)->data & 0x7fffffffffffffff;
          }
          else {
            if (GVar3 != GATE_SET) goto LAB_00c0b477;
            uVar4 = ((IndexPointer *)node)->data | 0x8000000000000000;
          }
          ((IndexPointer *)node)->data = uVar4;
LAB_00c0b477:
          Node4::InsertChild(this->art,(Node *)node,byte,local_88);
          Node4::InsertChild(this->art,(Node *)node,byte_00,
                             (Node)(entry->right->super_IndexPointer).data);
          (entry->right->super_IndexPointer).data = 0;
          return;
        }
        break;
      }
      iVar5 = iVar5 + 1;
    } while (pos != iVar5);
  }
  if (local_78.data[bVar1] == local_60.data[bVar1]) {
    iVar5 = ((local_60.ptr)->super_IndexPointer).data;
    ((local_60.ptr)->super_IndexPointer).data = 0;
    Node::Free(this->art,entry->right);
    (entry->right->super_IndexPointer).data = iVar5;
    Emplace(this,local_78.ptr,entry->right,entry->status,(ulong)local_78.data[bVar1] + entry->depth)
    ;
  }
  else {
    if (local_60.data[bVar1] == pos) {
      pNVar2 = entry->right;
      iVar5 = (entry->left->super_IndexPointer).data;
      (entry->left->super_IndexPointer).data = (pNVar2->super_IndexPointer).data;
      (pNVar2->super_IndexPointer).data = iVar5;
      local_78.ptr = local_60.ptr;
    }
    MergeNodeAndPrefix(this,local_78.ptr,entry->right,entry->status,entry->depth + (ulong)pos,pos);
  }
  return;
}

Assistant:

void ARTMerger::MergePrefixes(NodeEntry &entry) {
	D_ASSERT(entry.left.GetType() == NType::PREFIX);
	D_ASSERT(entry.right.GetType() == NType::PREFIX);

	// We traverse prefixes until we
	// Case 1: find a position where they differ.
	// Case 2: find that they are the same.
	// Case 3: find that one prefix contains the other.

	// Until we reach one of these cases, we keep reducing
	// the right prefix (and freeing the fully reduced nodes).
	// We can do so because up to any of these three cases,
	// the prefixes are the same. That means, we only need to keep
	// one of them around.

	Prefix l_prefix(art, entry.left, true);
	Prefix r_prefix(art, entry.right, true);
	const auto count = Prefix::Count(art);

	// Find a byte at pos where the prefixes differ.
	// If they match up to max_count, then pos stays invalid.
	const auto max_count = MinValue(l_prefix.data[count], r_prefix.data[count]);
	optional_idx pos;
	for (idx_t i = 0; i < max_count; i++) {
		if (l_prefix.data[i] != r_prefix.data[i]) {
			pos = i;
			break;
		}
	}

	if (pos.IsValid()) {
		// The prefixes differ at pos.
		// We split the left prefix, and reduce the right prefix.
		// Then, we insert both remainders into a new Node4.
		// Then, we are done.
		const auto cast_pos = UnsafeNumericCast<uint8_t>(pos.GetIndex());
		const auto l_byte = Prefix::GetByte(art, entry.left, cast_pos);
		const auto r_byte = Prefix::GetByte(art, entry.right, cast_pos);

		// Split and reduce.
		reference<Node> ref(entry.left);
		Node l_child;
		const auto status = Prefix::Split(art, ref, l_child, cast_pos);
		Prefix::Reduce(art, entry.right, cast_pos);

		Node4::New(art, ref);
		ref.get().SetGateStatus(status);

		Node4::InsertChild(art, ref, l_byte, l_child);
		Node4::InsertChild(art, ref, r_byte, entry.right);
		entry.right.Clear();
		return;
	}

	if (l_prefix.data[count] == r_prefix.data[count]) {
		// The prefixes match.
		// Free the right prefix, but keep the reference to its child alive.
		// Then, iterate on the left and right (reduced) child.
		auto r_child = *r_prefix.ptr;
		r_prefix.ptr->Clear();
		Node::Free(art, entry.right);
		entry.right = r_child;

		auto depth = entry.depth + l_prefix.data[count];
		Emplace(*l_prefix.ptr, entry.right, entry.status, depth);
		return;
	}

	// max_count indexes the byte after the exhausted prefix in a child node.
	if (r_prefix.data[count] == max_count) {
		// We exhausted the right prefix.
		// Ensure that we continue merging into left.
		swap(entry.left, entry.right);
		MergeNodeAndPrefix(*r_prefix.ptr, entry.right, entry.status, entry.depth + max_count, max_count);
		return;
	}

	// We exhausted the left prefix.
	MergeNodeAndPrefix(*l_prefix.ptr, entry.right, entry.status, entry.depth + max_count, max_count);
}